

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O3

vector<Patch::Change,_std::allocator<Patch::Change>_> * __thiscall
Patch::get_changes_in_range<Patch::NewCoordinates>
          (vector<Patch::Change,_std::allocator<Patch::Change>_> *__return_storage_ptr__,Patch *this
          ,Point start,Point end,bool inclusive)

{
  Text *this_00;
  Text *pTVar1;
  iterator __position;
  pointer pPVar2;
  bool bVar3;
  uint32_t uVar4;
  Point PVar5;
  Point PVar6;
  long lVar7;
  int iVar8;
  undefined3 in_register_00000081;
  int iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  size_type __new_size;
  size_type __new_size_00;
  initializer_list<Patch::PositionStackEntry> __l;
  vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> left_ancestor_stack;
  Point node_end;
  Point node_new_start;
  Point node_old_start;
  Change change;
  Point node_start;
  Point local_110;
  vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> local_108;
  Point local_f0;
  vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> local_e8;
  Point local_d0;
  uint32_t local_c8;
  undefined4 local_c4;
  Point local_c0;
  vector<Patch::Change,std::allocator<Patch::Change>> *local_b8;
  uint32_t local_ac;
  PositionStackEntry local_a8;
  Change local_90;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  local_c4 = CONCAT31(in_register_00000081,inclusive);
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110 = (Point)this->root;
  local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Node **)0x0;
  local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = (vector<Patch::Change,std::allocator<Patch::Change>> *)__return_storage_ptr__;
  local_48 = end;
  local_40 = start;
  Point::Point(&local_90.old_start);
  Point::Point(&local_90.old_end);
  local_90.new_start.row = 0;
  local_90.new_start.column = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_90;
  std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::vector
            (&local_e8,__l,(allocator_type *)&local_a8);
  if (local_110 == (Point)0x0) {
    __new_size = 0;
    __new_size_00 = 0;
    local_f0.row = 0;
    local_f0.column = 0;
  }
  else {
    local_f0.row = 0;
    local_f0.column = 0;
    __new_size_00 = 0;
    __new_size = 0;
    do {
      pPVar2 = local_e8.
               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_a8.old_end =
           Point::traverse(&local_e8.
                            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].old_end,
                           (Point *)((long)local_110 + 0x20));
      local_c0 = Point::traverse(&pPVar2[-1].new_end,(Point *)((long)local_110 + 0x28));
      PVar5 = Point::traverse(&local_a8.old_end,(Point *)((long)local_110 + 0x10));
      PVar6 = Point::traverse(&local_c0,(Point *)((long)local_110 + 0x18));
      local_d0 = PVar6;
      bVar3 = Point::operator>(&local_d0,&local_40);
      if ((bVar3) ||
         (((char)local_c4 != '\0' && (bVar3 = Point::operator==(&local_d0,&local_40), bVar3)))) {
        __new_size_00 =
             (long)local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
        __new_size = ((long)local_e8.
                            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_e8.
                            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        local_f0 = local_110;
        if (*(long *)local_110 == 0) break;
        if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>
                    ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)&local_108,
                     (iterator)
                     local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Node **)&local_110);
        }
        else {
          *local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (Node *)local_110;
          local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        if (*(long *)((long)local_110 + 8) == 0) break;
        lVar7 = *(long *)local_110;
        if (lVar7 == 0) {
          iVar8 = 0;
        }
        else {
          iVar8 = *(int *)(lVar7 + 0x44);
        }
        local_ac = pPVar2[-1].total_old_text_size;
        local_38 = PVar5;
        if (*(Text **)((long)local_110 + 0x30) == (Text *)0x0) {
          local_c8 = *(uint32_t *)((long)local_110 + 0x40);
        }
        else {
          local_c8 = Text::size(*(Text **)((long)local_110 + 0x30));
          lVar7 = *(long *)local_110;
        }
        uVar10 = 0;
        iVar9 = 0;
        if (lVar7 != 0) {
          iVar9 = *(int *)(lVar7 + 0x48);
        }
        uVar11 = pPVar2[-1].total_new_text_size;
        if (*(Text **)((long)local_110 + 0x38) != (Text *)0x0) {
          uVar10 = Text::size(*(Text **)((long)local_110 + 0x38));
        }
        local_90.new_start.column = iVar9 + uVar11 + uVar10;
        local_90.new_start.row = iVar8 + local_ac + local_c8;
        local_90.old_start = local_38;
        local_90.old_end = PVar6;
        if (local_e8.
            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_e8.
            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
          _M_realloc_insert<Patch::PositionStackEntry>
                    (&local_e8,
                     (iterator)
                     local_e8.
                     super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(PositionStackEntry *)&local_90);
        }
        else {
          (local_e8.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->total_old_text_size = local_90.new_start.row
          ;
          (local_e8.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->total_new_text_size =
               local_90.new_start.column;
          (local_e8.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->old_end = local_38;
          (local_e8.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->new_end = PVar6;
          local_e8.
          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_e8.
               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>
                    ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)&local_108,
                     (iterator)
                     local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Node **)&local_110);
        }
        else {
          *local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (Node *)local_110;
          local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_110 = (Point)((long)local_110 + 8);
      }
      local_110 = *(Point *)local_110;
    } while (local_110 != (Point)0x0);
  }
  local_110 = local_f0;
  std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::resize(&local_108,__new_size_00);
  std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::resize
            (&local_e8,__new_size);
  if (local_110 != (Point)0x0) {
    while( true ) {
      pPVar2 = local_e8.
               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_c0 = Point::traverse(&local_e8.
                                  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish[-1].old_end,
                                 (Point *)((long)local_110 + 0x20));
      local_d0 = Point::traverse(&pPVar2[-1].new_end,(Point *)((long)local_110 + 0x28));
      local_50 = local_d0;
      bVar3 = Point::operator>(&local_50,&local_48);
      if ((bVar3) ||
         (((char)local_c4 == '\0' && (bVar3 = Point::operator==(&local_50,&local_48), bVar3))))
      break;
      local_f0 = Point::traverse(&local_c0,(Point *)((long)local_110 + 0x10));
      PVar5 = Point::traverse(&local_d0,(Point *)((long)local_110 + 0x18));
      this_00 = *(Text **)((long)local_110 + 0x30);
      pTVar1 = *(Text **)((long)local_110 + 0x38);
      if (this_00 == (Text *)0x0) {
        local_90.old_text_size = *(uint32_t *)((long)local_110 + 0x40);
      }
      else {
        local_90.old_text_size = Text::size(this_00);
      }
      uVar10 = pPVar2[-1].total_old_text_size;
      lVar7 = *(long *)local_110;
      if (lVar7 == 0) {
        iVar8 = 0;
      }
      else {
        uVar10 = uVar10 + *(int *)(lVar7 + 0x44);
        iVar8 = *(int *)(lVar7 + 0x48);
      }
      uVar11 = iVar8 + pPVar2[-1].total_new_text_size;
      local_90.old_start = local_c0;
      local_90.old_end = local_f0;
      local_90.new_start = local_d0;
      __position._M_current = *(Change **)(local_b8 + 8);
      local_90.new_end = PVar5;
      local_90.old_text = this_00;
      local_90.new_text = pTVar1;
      local_90.preceding_old_text_size = uVar10;
      local_90.preceding_new_text_size = uVar11;
      if (__position._M_current == *(Change **)(local_b8 + 0x10)) {
        std::vector<Patch::Change,std::allocator<Patch::Change>>::
        _M_realloc_insert<Patch::Change_const&>(local_b8,__position,&local_90);
      }
      else {
        (__position._M_current)->preceding_old_text_size = uVar10;
        (__position._M_current)->preceding_new_text_size = uVar11;
        *(ulong *)&(__position._M_current)->old_text_size =
             CONCAT44(local_90._60_4_,local_90.old_text_size);
        (__position._M_current)->old_text = this_00;
        (__position._M_current)->new_text = pTVar1;
        (__position._M_current)->new_start = local_d0;
        (__position._M_current)->new_end = PVar5;
        (__position._M_current)->old_start = local_c0;
        (__position._M_current)->old_end = local_f0;
        *(Change **)(local_b8 + 8) = __position._M_current + 1;
      }
      PVar6 = local_110;
      pPVar2 = local_e8.
               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (*(long *)((long)local_110 + 8) == 0) {
        do {
          local_e8.
          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish = pPVar2;
          if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_110.row = 0;
            local_110.column = 0;
            goto LAB_0016ad47;
          }
          local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((Point *)local_108.
                                  super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + -1);
          local_110 = (Point)*local_108.
                              super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          bVar3 = *(Point *)((long)local_110 + 8) == PVar6;
          PVar6 = local_110;
          pPVar2 = local_e8.
                   super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
        } while (bVar3);
      }
      else {
        if (*(Text **)((long)local_110 + 0x30) == (Text *)0x0) {
          uVar4 = *(uint32_t *)((long)local_110 + 0x40);
        }
        else {
          uVar4 = Text::size(*(Text **)((long)local_110 + 0x30));
        }
        if (*(Text **)((long)local_110 + 0x38) == (Text *)0x0) {
          local_a8.total_new_text_size = 0;
        }
        else {
          local_a8.total_new_text_size = Text::size(*(Text **)((long)local_110 + 0x38));
        }
        local_a8.total_old_text_size = uVar4 + uVar10;
        local_a8.total_new_text_size = local_a8.total_new_text_size + uVar11;
        local_a8.old_end = local_f0;
        local_a8.new_end = PVar5;
        if (local_e8.
            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_e8.
            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
          _M_realloc_insert<Patch::PositionStackEntry>
                    (&local_e8,
                     (iterator)
                     local_e8.
                     super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_a8);
        }
        else {
          (local_e8.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->total_old_text_size =
               local_a8.total_old_text_size;
          (local_e8.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->total_new_text_size =
               local_a8.total_new_text_size;
          (local_e8.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->old_end = local_f0;
          (local_e8.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->new_end = PVar5;
          local_e8.
          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_e8.
               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>
                    ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)&local_108,
                     (iterator)
                     local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Node **)&local_110);
        }
        else {
          *local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (Node *)local_110;
          local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        for (local_110 = *(Point *)((long)local_110 + 8); *(long *)local_110 != 0;
            local_110 = *(Point *)local_110) {
          if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
            _M_realloc_insert<Patch::Node*const&>
                      ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)&local_108,
                       (iterator)
                       local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(Node **)&local_110);
          }
          else {
            *local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish = (Node *)local_110;
            local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
        }
      }
    }
  }
LAB_0016ad47:
  if (local_e8.
      super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((Point *)local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
               super__Vector_impl_data._M_start != (Point *)0x0) {
    operator_delete(local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (vector<Patch::Change,_std::allocator<Patch::Change>_> *)local_b8;
}

Assistant:

vector<Patch::Change> Patch::get_changes_in_range(Point start, Point end, bool inclusive) const {
  vector<Change> result;

  Node *node = root;
  vector<Node *> node_stack;
  vector<Patch::PositionStackEntry> left_ancestor_stack{{}};

  Node *found_node = nullptr;
  size_t found_node_ancestor_count = 0;
  size_t found_node_left_ancestor_count = 0;

  while (node) {
    auto &left_ancestor_info = left_ancestor_stack.back();
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    Point node_old_end = node_old_start.traverse(node->old_extent);
    Point node_new_end = node_new_start.traverse(node->new_extent);

    Point node_end = CoordinateSpace::choose(node_old_end, node_new_end);
    if (node_end > start || (inclusive && node_end == start)) {
      found_node_ancestor_count = node_stack.size();
      found_node_left_ancestor_count = left_ancestor_stack.size();
      found_node = node;
      if (node->left) {
        node_stack.push_back(node);
        node = node->left;
      } else {
        break;
      }
    } else {
      if (node->right) {
        left_ancestor_stack.push_back({
          node_old_end,
          node_new_end,
          left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size() + node->old_text_size(),
          left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size() + node->new_text_size()
        });
        node_stack.push_back(node);
        node = node->right;
      } else {
        break;
      }
    }
  }

  node = found_node;
  node_stack.resize(found_node_ancestor_count);
  left_ancestor_stack.resize(found_node_left_ancestor_count);

  while (node) {
    PositionStackEntry &left_ancestor_info = left_ancestor_stack.back();
    Point old_start = left_ancestor_info.old_end.traverse(
        node->old_distance_from_left_ancestor);
    Point new_start = left_ancestor_info.new_end.traverse(
        node->new_distance_from_left_ancestor);
    Point node_start = CoordinateSpace::choose(old_start, new_start);
    if (node_start > end || (!inclusive && node_start == end)) break;

    Point old_end = old_start.traverse(node->old_extent);
    Point new_end = new_start.traverse(node->new_extent);
    Text *old_text = node->old_text.get();
    Text *new_text = node->new_text.get();
    uint32_t old_text_size = node->old_text_size();
    uint32_t preceding_old_text_size =
      left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size();
    uint32_t preceding_new_text_size =
      left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size();
    Change change{
      old_start,
      old_end,
      new_start,
      new_end,
      old_text,
      new_text,
      preceding_old_text_size,
      preceding_new_text_size,
      old_text_size,
    };
    result.push_back(change);

    if (node->right) {
      left_ancestor_stack.push_back(PositionStackEntry{
        old_end,
        new_end,
        preceding_old_text_size + node->old_text_size(),
        preceding_new_text_size + node->new_text_size()
      });
      node_stack.push_back(node);
      node = node->right;

      while (node->left) {
        node_stack.push_back(node);
        node = node->left;
      }
    } else {
      while (!node_stack.empty() && node_stack.back()->right == node) {
        node = node_stack.back();
        node_stack.pop_back();
        left_ancestor_stack.pop_back();
      }

      if (node_stack.empty()) {
        node = nullptr;
      } else {
        node = node_stack.back();
        node_stack.pop_back();
      }
    }
  }

  return result;
}